

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O3

unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_> __thiscall
enact::Parser::parsePrecMultiply(Parser *this)

{
  size_type *psVar1;
  pointer pcVar2;
  CompileContext *pCVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  CompileContext *pCVar6;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar7;
  pointer *__ptr_1;
  pointer *__ptr;
  Parser *in_RSI;
  Token oper;
  undefined1 local_98 [16];
  size_type *local_88;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_80;
  size_t sStack_70;
  line_t local_68;
  col_t local_64;
  size_type local_48;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_40;
  
  parsePrecBitwiseShift(this);
  if ((in_RSI->m_current).type - SLASH < 2) {
    psVar1 = (size_type *)(local_80._M_local_buf + 8);
    do {
      advance(in_RSI);
      local_98._8_4_ = (in_RSI->m_previous).type;
      pcVar2 = (in_RSI->m_previous).lexeme._M_dataplus._M_p;
      local_88 = psVar1;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_88,pcVar2,pcVar2 + (in_RSI->m_previous).lexeme._M_string_length);
      local_64 = (in_RSI->m_previous).col;
      local_68 = (in_RSI->m_previous).line;
      parsePrecBitwiseShift((Parser *)local_98);
      pCVar6 = (CompileContext *)operator_new(0x48);
      uVar5 = local_80._M_allocated_capacity;
      uVar4 = local_98._0_8_;
      pCVar3 = this->m_context;
      this->m_context = (CompileContext *)0x0;
      local_98._0_8_ = (CompileContext *)0x0;
      if (local_88 == psVar1) {
        aStack_40._M_allocated_capacity = sStack_70;
        local_88 = &local_48;
      }
      local_48 = CONCAT71(local_80._9_7_,local_80._M_local_buf[8]);
      local_80._M_allocated_capacity = 0;
      local_80._M_local_buf[8] = '\0';
      (pCVar6->m_source)._M_dataplus._M_p = (pointer)&PTR__BinaryExpr_00127528;
      (pCVar6->m_source)._M_string_length = (size_type)pCVar3;
      (pCVar6->m_source).field_2._M_allocated_capacity = uVar4;
      *(undefined4 *)((long)&(pCVar6->m_source).field_2 + 8) = local_98._8_4_;
      paVar7 = &(pCVar6->m_options).m_filename.field_2;
      (pCVar6->m_options).m_filename._M_dataplus._M_p = (pointer)paVar7;
      if (local_88 == &local_48) {
        paVar7->_M_allocated_capacity = local_48;
        *(size_type *)((long)&(pCVar6->m_options).m_filename.field_2 + 8) =
             aStack_40._M_allocated_capacity;
      }
      else {
        (pCVar6->m_options).m_filename._M_dataplus._M_p = (pointer)local_88;
        (pCVar6->m_options).m_filename.field_2._M_allocated_capacity = local_48;
      }
      (pCVar6->m_options).m_filename._M_string_length = uVar5;
      *(line_t *)
       &(pCVar6->m_options).m_programArgs.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = local_68;
      *(col_t *)((long)&(pCVar6->m_options).m_programArgs.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start + 4) = local_64;
      this->m_context = pCVar6;
      local_88 = psVar1;
    } while ((in_RSI->m_current).type - SLASH < 2);
  }
  return (__uniq_ptr_data<enact::Expr,_std::default_delete<enact::Expr>,_true,_true>)
         (__uniq_ptr_data<enact::Expr,_std::default_delete<enact::Expr>,_true,_true>)this;
}

Assistant:

std::unique_ptr<Expr> Parser::parsePrecMultiply() {
        std::unique_ptr<Expr> expr = parsePrecBitwiseShift();

        while (consume(TokenType::STAR) ||
               consume(TokenType::SLASH)) {
            Token oper = m_previous;
            std::unique_ptr<Expr> rightExpr = parsePrecBitwiseShift();
            expr = std::make_unique<BinaryExpr>(std::move(expr), std::move(rightExpr), std::move(oper));
        }

        return expr;
    }